

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjTable::reset_to_image(CVmObjTable *this)

{
  void *pvVar1;
  CVmObject *pCVar2;
  CVmObjPageEntry *pCVar3;
  CVmObjGlobPage *in_RDI;
  vm_image_ptr *slot;
  size_t cnt;
  vm_image_ptr_page *ip_page;
  vm_obj_id_t id;
  size_t j;
  size_t i;
  CVmObjPageEntry *entry;
  CVmObjPageEntry **pg;
  vm_obj_id_t *local_48;
  long local_40;
  long *local_38;
  uint local_2c;
  long local_28;
  long local_20;
  CVmObjPageEntry *local_18;
  undefined8 *local_10;
  
  CVmUndo::drop_undo((CVmUndo *)in_RDI);
  if (in_RDI->used_ != 0) {
    pvVar1 = (void *)in_RDI->used_;
    if (pvVar1 != (void *)0x0) {
      CVmObjGlobPage::~CVmObjGlobPage(in_RDI);
      operator_delete(pvVar1,0x88);
    }
    in_RDI->used_ = 0;
  }
  local_2c = 0;
  local_10 = *(undefined8 **)(in_RDI->objs_ + 2);
  for (local_20 = *(long *)(in_RDI->objs_ + 6); local_20 != 0; local_20 = local_20 + -1) {
    local_28 = 0x1000;
    local_18 = (CVmObjPageEntry *)*local_10;
    for (; local_28 != 0; local_28 = local_28 + -1) {
      if ((((*(ushort *)&local_18->field_0x14 & 1) == 0) &&
          ((*(ushort *)&local_18->field_0x14 >> 1 & 1) != 0)) &&
         ((*(ushort *)&local_18->field_0x14 >> 7 & 1) == 0)) {
        pCVar2 = CVmObjPageEntry::get_vm_obj(local_18);
        (*pCVar2->_vptr_CVmObject[0x1b])(pCVar2,(ulong)local_2c);
      }
      local_18 = local_18 + 1;
      local_2c = local_2c + 1;
    }
    local_10 = local_10 + 1;
  }
  for (local_38 = *(long **)(in_RDI->objs_ + 10); local_38 != (long *)0x0;
      local_38 = (long *)*local_38) {
    if (*local_38 == 0) {
      local_40 = *(long *)(in_RDI->objs_ + 0xe);
    }
    else {
      local_40 = 400;
    }
    local_48 = (vm_obj_id_t *)(local_38 + 1);
    for (; local_40 != 0; local_40 = local_40 + -1) {
      pCVar3 = get_entry((CVmObjTable *)in_RDI,*local_48);
      if ((*(ushort *)&pCVar3->field_0x14 >> 7 & 1) == 0) {
        pCVar2 = vm_objp(0);
        (*pCVar2->_vptr_CVmObject[0x1a])
                  (pCVar2,(ulong)*local_48,*(undefined8 *)(local_48 + 2),
                   *(undefined8 *)(local_48 + 4));
      }
      local_48 = local_48 + 6;
    }
  }
  return;
}

Assistant:

void CVmObjTable::reset_to_image(VMG0_)
{
    CVmObjPageEntry **pg;
    CVmObjPageEntry *entry;
    size_t i;
    size_t j;
    vm_obj_id_t id;
    vm_image_ptr_page *ip_page;

    /* 
     *   Drop all undo information.  Since we're resetting to the initial
     *   state, the undo for our outgoing state will no longer be
     *   relevant. 
     */
    G_undo->drop_undo(vmg0_);

    /* delete all of the globals */
    if (globals_ != 0)
    {
        delete globals_;
        globals_ = 0;
    }

    /* 
     *   Go through the object table and reset each non-transient object in
     *   the root set to its initial conditions.  
     */
    for (id = 0, i = pages_used_, pg = pages_ ; i > 0 ; ++pg, --i)
    {
        /* scan all objects on this page */
        for (j = VM_OBJ_PAGE_CNT, entry = *pg ; j > 0 ; --j, ++entry, ++id)
        {
            /* 
             *   if it's not free, and it's in the root set, and it's not
             *   transient, reset it 
             */
            if (!entry->free_ && entry->in_root_set_ && !entry->transient_)
            {
                /*
                 *   This object is part of the root set, so it's part of
                 *   the state immediately after loading the image.  Reset
                 *   the object to its load file conditions.  
                 */
                entry->get_vm_obj()->reset_to_image(vmg_ id);
            }
        }
    }

    /*
     *   Go through all of the objects for which we've explicitly saved the
     *   original image file location, and ask them to reset using the image
     *   data. 
     */
    for (ip_page = image_ptr_head_ ; ip_page != 0 ; ip_page = ip_page->next_)
    {
        size_t cnt;
        vm_image_ptr *slot;
        
        /* 
         *   get the count for this page - if this is the last page, it's
         *   the last page counter; otherwise, it's a full page, since we
         *   fill up each page before creating a new one 
         */
        if (ip_page->next_ == 0)
            cnt = image_ptr_last_cnt_;
        else
            cnt = VM_IMAGE_PTRS_PER_PAGE;

        /* go through the records on the page */
        for (slot = ip_page->ptrs_ ; cnt != 0 ; --cnt, ++slot)
        {
            /* it this object is non-transient, reload it */
            if (!get_entry(slot->obj_id_)->transient_)
            {
                /* reload it using the saved image data */
                vm_objp(vmg_ slot->obj_id_)
                    ->reload_from_image(vmg_ slot->obj_id_,
                                        slot->image_data_ptr_,
                                        slot->image_data_len_);
            }
        }
    }
}